

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::getObjectName(ObjFileParser *this)

{
  Object *pOVar1;
  undefined8 __beg;
  bool bVar2;
  __type _Var3;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var4;
  reference pcVar5;
  ulong uVar6;
  pointer pMVar7;
  reference ppOVar8;
  byte local_a1;
  __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_80;
  __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_78;
  __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_70;
  const_iterator it;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string strObjectName;
  char *pStart;
  ObjFileParser *this_local;
  
  _Var4 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var4._M_current;
  bVar2 = __gnu_cxx::operator==(&this->m_DataIt,&this->m_DataItEnd);
  if (!bVar2) {
    strObjectName.field_2._8_8_ =
         __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator*
                   (&this->m_DataIt);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&this->m_DataIt,&this->m_DataItEnd);
      local_a1 = 0;
      if (bVar2) {
        pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&this->m_DataIt);
        bVar2 = IsSpaceOrNewLine<char>(*pcVar5);
        local_a1 = bVar2 ^ 0xff;
      }
      __beg = strObjectName.field_2._8_8_;
      if ((local_a1 & 1) == 0) break;
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&this->m_DataIt);
    }
    pcVar5 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>((string *)local_50,(char *)__beg,pcVar5,&local_51);
    std::allocator<char>::~allocator(&local_51);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar7->m_pCurrent = (Object *)0x0;
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      local_78._M_current =
           (Object **)
           std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::begin
                     (&pMVar7->m_Objects);
      __gnu_cxx::
      __normal_iterator<Assimp::ObjFile::Object*const*,std::vector<Assimp::ObjFile::Object*,std::allocator<Assimp::ObjFile::Object*>>>
      ::__normal_iterator<Assimp::ObjFile::Object**>
                ((__normal_iterator<Assimp::ObjFile::Object*const*,std::vector<Assimp::ObjFile::Object*,std::allocator<Assimp::ObjFile::Object*>>>
                  *)&local_70,&local_78);
      while( true ) {
        pMVar7 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        local_80._M_current =
             (Object **)
             std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::end
                       (&pMVar7->m_Objects);
        bVar2 = __gnu_cxx::operator!=(&local_70,&local_80);
        if (!bVar2) break;
        ppOVar8 = __gnu_cxx::
                  __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
                  ::operator*(&local_70);
        _Var3 = std::operator==(&(*ppOVar8)->m_strObjName,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50);
        if (_Var3) {
          ppOVar8 = __gnu_cxx::
                    __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
                    ::operator*(&local_70);
          pOVar1 = *ppOVar8;
          pMVar7 = std::
                   unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                   ::operator->(&this->m_pModel);
          pMVar7->m_pCurrent = pOVar1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<Assimp::ObjFile::Object_*const_*,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
        ::operator++(&local_70);
      }
      pMVar7 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      if (pMVar7->m_pCurrent == (Object *)0x0) {
        createObject(this,(string *)local_50);
      }
    }
    _Var4 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
    (this->m_DataIt)._M_current = _Var4._M_current;
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void ObjFileParser::getObjectName()
{
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if( m_DataIt == m_DataItEnd ) {
        return;
    }
    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        ++m_DataIt;
    }

    std::string strObjectName(pStart, &(*m_DataIt));
    if (!strObjectName.empty())
    {
        // Reset current object
        m_pModel->m_pCurrent = NULL;

        // Search for actual object
        for (std::vector<ObjFile::Object*>::const_iterator it = m_pModel->m_Objects.begin();
            it != m_pModel->m_Objects.end();
            ++it)
        {
            if ((*it)->m_strObjName == strObjectName)
            {
                m_pModel->m_pCurrent = *it;
                break;
            }
        }

        // Allocate a new object, if current one was not found before
        if( NULL == m_pModel->m_pCurrent ) {
            createObject( strObjectName );
        }
    }
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}